

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O2

bool am_active_if_change_width_and_not_user_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Get_Sibling(&local_18,(Am_Slot_Key)self,(ulong)Am_CHANGE_WIDTH);
  pAVar3 = Am_Object::Get(&local_18,0x169,0);
  bVar1 = Am_Value::Valid(pAVar3);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_20,(Am_Slot_Key)self,(ulong)Am_WIDTH_HOW);
    pAVar3 = Am_Object::Get(&local_20,0x169,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    bVar1 = iVar2 < 100;
    Am_Object::~Am_Object(&local_20);
  }
  else {
    bVar1 = false;
  }
  Am_Object::~Am_Object(&local_18);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, am_active_if_change_width_and_not_user)
{
  return self.Get_Sibling(Am_CHANGE_WIDTH).Get(Am_VALUE).Valid() &&
         (int)self.Get_Sibling(Am_WIDTH_HOW).Get(Am_VALUE) < am_ask_user_base;
}